

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildReg3
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,ProfileId profileId)

{
  _func_int **pp_Var1;
  IRKind IVar2;
  uint uVar3;
  Opnd *pOVar4;
  StackSym *pSVar5;
  code *pcVar6;
  OpndKind OVar7;
  bool bVar8;
  uint uVar9;
  RegSlot RVar10;
  BOOL BVar11;
  JITTimeFunctionBody *pJVar12;
  RegOpnd *pRVar13;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *src2Opnd;
  Instr *instr;
  undefined4 *puVar14;
  RegOpnd *this_00;
  RegOpnd *dstOpnd;
  JITTimeProfileInfo *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar15;
  JitProfilingInstr *instr_00;
  undefined6 in_register_00000032;
  byte bVar16;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  ProfileId local_36;
  uint32 local_34;
  ValueType arrayType;
  
  local_34 = offset;
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0xe0) {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetInnerScopeCount(pJVar12);
    if (uVar9 <= dstRegSlot) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar10 = JITTimeFunctionBody::GetFirstInnerScopeReg(pJVar12);
    pRVar13 = BuildDstOpnd(this,dstRegSlot + RVar10,TyVar,false,false);
    src1Opnd = IR::IntConstOpnd::New((ulong)src1RegSlot,TyVar,this->m_func,false);
    src2Opnd = IR::IntConstOpnd::New((ulong)src2RegSlot,TyVar,this->m_func,false);
    instr = IR::Instr::New(NewScopeSlotsWithoutPropIds,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,
                           &src2Opnd->super_Opnd,this->m_func);
    pOVar4 = instr->m_dst;
    OVar7 = IR::Opnd::GetKind(pOVar4);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_004caeb0;
      *puVar14 = 0;
    }
    if (((ulong)pOVar4[1]._vptr_Opnd[3] & 1) != 0) {
      pOVar4 = instr->m_dst;
      OVar7 = IR::Opnd::GetKind(pOVar4);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar8) goto LAB_004caeb0;
        *puVar14 = 0;
      }
      pp_Var1 = pOVar4[1]._vptr_Opnd + 3;
      *(uint *)pp_Var1 = *(uint *)pp_Var1 | 2;
    }
    AddInstr(this,instr,local_34);
    return;
  }
  pRVar13 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  this_00 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  dstOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  pSVar5 = dstOpnd->m_sym;
  if (newOpcode == IsIn && profileId != 0xffff) {
    local_36 = profileId;
    bVar8 = DoLoadInstructionArrayProfileInfo(this);
    if (!bVar8) goto LAB_004cad11;
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar12);
    paVar15 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
              JITTimeProfileInfo::GetLdElemInfo(this_01,profileId);
    local_38.field_0 = paVar15->field_0;
    bVar16 = *(byte *)((long)paVar15 + 5);
    bVar8 = ValueType::IsLikelyNativeArray((ValueType *)&local_38.field_0);
    local_48 = paVar15;
    if ((bVar8) && (bVar8 = AllowNativeArrayProfileInfo(this), !bVar8)) {
      local_38.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_38.field_0,TypeIds_Array);
      local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 new<Memory::JitArenaAllocator>(6,this->m_func->m_alloc,0x3eba5c);
      *(undefined4 *)local_48 = *(undefined4 *)paVar15;
      local_48[2] = paVar15[2];
      local_48->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_38;
    }
    bVar16 = bVar16 ^ 1;
    IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)local_38.field_0);
    BVar11 = Func::HasTry(this->m_func->topFunc);
    if ((BVar11 == 0) || (bVar8 = Func::DoOptimizeTry(this->m_func->topFunc), bVar8))
    goto LAB_004cac77;
LAB_004cad14:
    instr_00 = (JitProfilingInstr *)
               IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&pRVar13->super_Opnd,
                              &this_00->super_Opnd,this->m_func);
LAB_004cae42:
    AddInstr(this,&instr_00->super_Instr,local_34);
    if ((bVar16 & 1) == 0) goto LAB_004cae6b;
  }
  else {
    if (profileId == 0xffff) {
LAB_004cad11:
      bVar16 = 0;
      goto LAB_004cad14;
    }
    local_36 = profileId;
    local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    bVar16 = 0;
LAB_004cac77:
    bVar8 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if (bVar8) {
      instr_00 = IR::JitProfilingInstr::New
                           (newOpcode,&dstOpnd->super_Opnd,&pRVar13->super_Opnd,&this_00->super_Opnd
                            ,this->m_func);
      if ((instr_00->super_Instr).m_kind != InstrKindJitProfiling) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
        if (!bVar8) goto LAB_004caeb0;
        *puVar14 = 0;
      }
      instr_00->profileId = local_36;
      goto LAB_004cae42;
    }
    instr_00 = (JitProfilingInstr *)
               IR::ProfiledInstr::New
                         (newOpcode,&dstOpnd->super_Opnd,&pRVar13->super_Opnd,&this_00->super_Opnd,
                          this->m_func);
    IVar2 = (instr_00->super_Instr).m_kind;
    if (newOpcode != IsIn) {
      if (IVar2 != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar8) goto LAB_004caeb0;
        *puVar14 = 0;
      }
      instr_00->profileId = (short)(uint)profileId;
      instr_00->arrayProfileId = (short)((uint)profileId >> 0x10);
      goto LAB_004cae42;
    }
    if (IVar2 != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar8) {
LAB_004caeb0:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar14 = 0;
    }
    *(anon_union_2_4_ea848c7b_for_ValueType_13 **)&instr_00->profileId = local_48;
    AddInstr(this,(Instr *)instr_00,local_34);
    if ((bVar16 & 1) == 0) {
      return;
    }
  }
  bVar8 = DoBailOnNoProfile(this);
  if (bVar8) {
    InsertBailOnNoProfile(this,&instr_00->super_Instr);
  }
LAB_004cae6b:
  if ((((newOpcode == LdInnerFrameDisplay) || (newOpcode == NewScopeSlotsWithoutPropIds)) ||
      (newOpcode == LdHandlerScope)) && (uVar3 = *(uint *)&pSVar5->field_0x18, (uVar3 & 1) != 0)) {
    *(uint *)&pSVar5->field_0x18 = uVar3 | 2;
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg3(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                        Js::RegSlot src2RegSlot, Js::ProfileId profileId)
{
    IR::Instr *     instr;

    if (newOpcode == Js::OpCode::NewInnerScopeSlots)
    {
        if (dstRegSlot >= m_func->GetJITFunctionBody()->GetInnerScopeCount())
        {
            Js::Throw::FatalInternalError();
        }
        newOpcode = Js::OpCode::NewScopeSlotsWithoutPropIds;
        dstRegSlot += m_func->GetJITFunctionBody()->GetFirstInnerScopeReg();
        instr = IR::Instr::New(newOpcode, BuildDstOpnd(dstRegSlot),
                               IR::IntConstOpnd::New(src1RegSlot, TyVar, m_func),
                               IR::IntConstOpnd::New(src2RegSlot, TyVar, m_func),
                               m_func);
        if (instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)
        {
            instr->GetDst()->AsRegOpnd()->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd *   src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);
    StackSym *      dstSym = dstOpnd->m_sym;

    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool wasNotProfiled = false;
    const Js::LdElemInfo * ldElemInfo = nullptr;

    if (isProfiledInstr && newOpcode == Js::OpCode::IsIn)
    {
        if (!DoLoadInstructionArrayProfileInfo())
        {
            isProfiledInstr = false;
        }
        else
        {
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            ValueType arrayType = ldElemInfo->GetArrayType();
            wasNotProfiled = !ldElemInfo->WasProfiled();

            if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
            {
                arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

                // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }

            src2Opnd->SetValueType(arrayType);

            if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
            {
                isProfiledInstr = false;
            }
        }
    }

    if (isProfiledInstr)
    {
        if (m_func->DoSimpleJitDynamicProfile())
        {
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (newOpcode == Js::OpCode::IsIn)
            {
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
    
    switch (newOpcode)
    {
    case Js::OpCode::LdHandlerScope:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;

    case Js::OpCode::LdInnerFrameDisplay:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;
    }
}